

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_assoc.cpp
# Opt level: O2

Assoc * __thiscall
Omega_h::get_box_assoc_abi_cxx11_(Assoc *__return_storage_ptr__,Omega_h *this,int dim)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
  *pmVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
  *pmVar2;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *pvVar3;
  int iVar4;
  allocator local_59;
  undefined8 local_58;
  key_type local_50;
  
  std::
  array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
  ::array(__return_storage_ptr__);
  iVar4 = (int)this;
  if (iVar4 == 3) {
    local_58 = 0x400000002;
    std::__cxx11::string::string((string *)&local_50,"z-",&local_59);
    pmVar1 = __return_storage_ptr__->_M_elems + 2;
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x400000002;
    std::__cxx11::string::string((string *)&local_50,"z-",&local_59);
    pmVar2 = __return_storage_ptr__->_M_elems + 1;
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xa00000002;
    std::__cxx11::string::string((string *)&local_50,"y-",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xa00000002;
    std::__cxx11::string::string((string *)&local_50,"y-",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xc00000002;
    std::__cxx11::string::string((string *)&local_50,"x-",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xc00000002;
    std::__cxx11::string::string((string *)&local_50,"x-",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xd00000003;
    std::__cxx11::string::string((string *)&local_50,"body",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xd00000003;
    std::__cxx11::string::string((string *)&local_50,"body",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xe00000002;
    std::__cxx11::string::string((string *)&local_50,"x+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0xe00000002;
    std::__cxx11::string::string((string *)&local_50,"x+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x1000000002;
    std::__cxx11::string::string((string *)&local_50,"y+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x1000000002;
    std::__cxx11::string::string((string *)&local_50,"y+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x1600000002;
    std::__cxx11::string::string((string *)&local_50,"z+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x1600000002;
    std::__cxx11::string::string((string *)&local_50,"z+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
  }
  else if (iVar4 == 2) {
    local_58 = 0x100000001;
    std::__cxx11::string::string((string *)&local_50,"y-",&local_59);
    pmVar1 = __return_storage_ptr__->_M_elems + 2;
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x100000001;
    std::__cxx11::string::string((string *)&local_50,"y-",&local_59);
    pmVar2 = __return_storage_ptr__->_M_elems + 1;
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x300000001;
    std::__cxx11::string::string((string *)&local_50,"x-",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x300000001;
    std::__cxx11::string::string((string *)&local_50,"x-",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x400000002;
    std::__cxx11::string::string((string *)&local_50,"body",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x400000002;
    std::__cxx11::string::string((string *)&local_50,"body",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x500000001;
    std::__cxx11::string::string((string *)&local_50,"x+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x500000001;
    std::__cxx11::string::string((string *)&local_50,"x+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x700000001;
    std::__cxx11::string::string((string *)&local_50,"y+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x700000001;
    std::__cxx11::string::string((string *)&local_50,"y+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
  }
  else {
    if (iVar4 != 1) {
      return __return_storage_ptr__;
    }
    local_58 = 0;
    std::__cxx11::string::string((string *)&local_50,"x-",&local_59);
    pmVar1 = __return_storage_ptr__->_M_elems + 2;
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0;
    std::__cxx11::string::string((string *)&local_50,"x-",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems + 1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x100000001;
    std::__cxx11::string::string((string *)&local_50,"body",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x100000001;
    std::__cxx11::string::string((string *)&local_50,"body",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x200000000;
    std::__cxx11::string::string((string *)&local_50,"x+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_58 = 0x200000000;
    std::__cxx11::string::string((string *)&local_50,"x+",&local_59);
    pvVar3 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems + 1,&local_50);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar3,&local_58,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Assoc get_box_assoc(int dim) {
  Assoc assoc;
  if (dim == 1) {
    assoc[NODE_SET]["x-"] = {{0, 0}};
    assoc[SIDE_SET]["x-"] = {{0, 0}};
    assoc[NODE_SET]["body"] = {{1, 1}};
    assoc[ELEM_SET]["body"] = {{1, 1}};
    assoc[NODE_SET]["x+"] = {{0, 2}};
    assoc[SIDE_SET]["x+"] = {{0, 2}};
  } else if (dim == 2) {
    assoc[NODE_SET]["y-"] = {{1, 1}};
    assoc[SIDE_SET]["y-"] = {{1, 1}};
    assoc[NODE_SET]["x-"] = {{1, 3}};
    assoc[SIDE_SET]["x-"] = {{1, 3}};
    assoc[NODE_SET]["body"] = {{2, 4}};
    assoc[ELEM_SET]["body"] = {{2, 4}};
    assoc[NODE_SET]["x+"] = {{1, 5}};
    assoc[SIDE_SET]["x+"] = {{1, 5}};
    assoc[NODE_SET]["y+"] = {{1, 7}};
    assoc[SIDE_SET]["y+"] = {{1, 7}};
  } else if (dim == 3) {
    assoc[NODE_SET]["z-"] = {{2, 4}};
    assoc[SIDE_SET]["z-"] = {{2, 4}};
    assoc[NODE_SET]["y-"] = {{2, 10}};
    assoc[SIDE_SET]["y-"] = {{2, 10}};
    assoc[NODE_SET]["x-"] = {{2, 12}};
    assoc[SIDE_SET]["x-"] = {{2, 12}};
    assoc[NODE_SET]["body"] = {{3, 13}};
    assoc[ELEM_SET]["body"] = {{3, 13}};
    assoc[NODE_SET]["x+"] = {{2, 14}};
    assoc[SIDE_SET]["x+"] = {{2, 14}};
    assoc[NODE_SET]["y+"] = {{2, 16}};
    assoc[SIDE_SET]["y+"] = {{2, 16}};
    assoc[NODE_SET]["z+"] = {{2, 22}};
    assoc[SIDE_SET]["z+"] = {{2, 22}};
  }
  return assoc;
}